

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.hpp
# Opt level: O2

void __thiscall cppjit::builder::builder::builder(builder *this,builder *other)

{
  allocator local_31;
  
  this->_vptr_builder = (_func_int **)&PTR___cxa_pure_virtual_00108d80;
  std::__cxx11::string::string((string *)&this->kernel_name,(string *)&other->kernel_name);
  this->verbose = other->verbose;
  this->do_cleanup = true;
  this->has_source_ = other->has_source_;
  this->has_inline_source_ = other->has_inline_source_;
  std::__cxx11::string::string((string *)&this->source,(string *)&other->source);
  (this->source_dir)._M_dataplus._M_p = (pointer)&(this->source_dir).field_2;
  (this->source_dir)._M_string_length = 0;
  (this->source_dir).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&this->compile_dir,"",&local_31);
  this->compile_dir_created = false;
  this->kernel_library = (void *)0x0;
  if (other->has_inline_source_ == false) {
    std::__cxx11::string::_M_assign((string *)&this->source_dir);
  }
  return;
}

Assistant:

builder(const builder &other)
      : kernel_name(other.kernel_name),
        verbose(other.verbose),
        do_cleanup(true),
        has_source_(other.has_source_),
        has_inline_source_(other.has_inline_source_),
        source(other.source),
        compile_dir(""),
        compile_dir_created(false),
        kernel_library(nullptr) {
    if (!other.has_inline_source_) {
      source_dir = other.source_dir;
    }
  }